

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

void display_player_xtra_info(void)

{
  panel *p_00;
  panel *p;
  size_t i;
  
  for (p = (panel *)0x0; p < (panel *)0x5; p = (panel *)((long)&p->len + 1)) {
    p_00 = (*panels[(long)p].panel)();
    display_panel(p_00,(_Bool)(panels[(long)p].align_left & 1),&panels[(long)p].bounds);
    panel_free(p_00);
  }
  text_out_wrap = L'H';
  text_out_indent = L'\x01';
  Term_gotoxy(L'\x01',L'\x13');
  text_out_to_screen('\x01',player->history);
  text_out_wrap = L'\0';
  text_out_indent = L'\0';
  return;
}

Assistant:

void display_player_xtra_info(void)
{
	size_t i;
	for (i = 0; i < N_ELEMENTS(panels); i++) {
		struct panel *p = panels[i].panel();
		display_panel(p, panels[i].align_left, &panels[i].bounds);
		panel_free(p);
	}

	/* Indent output by 1 character, and wrap at column 72 */
	text_out_wrap = 72;
	text_out_indent = 1;

	/* History */
	Term_gotoxy(text_out_indent, 19);
	text_out_to_screen(COLOUR_WHITE, player->history);

	/* Reset text_out() vars */
	text_out_wrap = 0;
	text_out_indent = 0;

	return;
}